

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.hpp
# Opt level: O1

string_view __thiscall cinatra::http_parser::get_header_value(http_parser *this,string_view key)

{
  char cVar1;
  size_t sVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  difference_type __d1;
  size_t sVar8;
  bool bVar9;
  string_view sVar10;
  difference_type __d2;
  
  sVar5 = this->num_headers_;
  if (sVar5 == 0) {
    pcVar6 = (char *)0x0;
    sVar5 = 0;
  }
  else {
    sVar7 = 0;
    do {
      sVar2 = (this->headers_)._M_elems[sVar7].name._M_len;
      if (sVar2 == key._M_len) {
        bVar9 = sVar2 == 0;
        if (bVar9) {
LAB_00123e27:
          if (bVar9) {
            sVar5 = (this->headers_)._M_elems[sVar7].value._M_len;
            pcVar6 = (this->headers_)._M_elems[sVar7].value._M_str;
            goto LAB_00123e58;
          }
        }
        else {
          pcVar6 = (this->headers_)._M_elems[sVar7].name._M_str;
          cVar1 = *key._M_str;
          iVar3 = tolower((int)*pcVar6);
          iVar4 = tolower((int)cVar1);
          if (iVar3 == iVar4) {
            sVar8 = 1;
            do {
              bVar9 = sVar2 == sVar8;
              if (bVar9) goto LAB_00123e27;
              cVar1 = key._M_str[sVar8];
              iVar3 = tolower((int)pcVar6[sVar8]);
              iVar4 = tolower((int)cVar1);
              sVar8 = sVar8 + 1;
            } while (iVar3 == iVar4);
          }
        }
      }
      sVar7 = sVar7 + 1;
    } while (sVar7 != sVar5);
    sVar5 = 0;
    pcVar6 = (char *)0x0;
  }
LAB_00123e58:
  sVar10._M_str = pcVar6;
  sVar10._M_len = sVar5;
  return sVar10;
}

Assistant:

std::string_view get_header_value(std::string_view key) const {
    for (size_t i = 0; i < num_headers_; i++) {
      if (iequal0(headers_[i].name, key))
        return headers_[i].value;
    }
    return {};
  }